

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

size_t req_stream_size(rtr_bgpsec *data,align_type type)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint bytes_len;
  uint8_t nlri_len_b;
  uint sig_segs_size;
  align_type type_local;
  rtr_bgpsec *data_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = get_sig_seg_size(data->sigs,type);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ulong)((data->nlri->nlri_len + 7 >> 3) + iVar2 + 9 +
                  ((uint)data->path_len + (uint)data->path_len * 2) * 2);
  }
  __stack_chk_fail();
}

Assistant:

size_t req_stream_size(const struct rtr_bgpsec *data, enum align_type type)
{
	unsigned int sig_segs_size = get_sig_seg_size(data->sigs, type);
	uint8_t nlri_len_b = (data->nlri->nlri_len + 7) / 8; // bits to bytes
	unsigned int bytes_len = 9 // alg(1) + afi(2) + safi(1) + asn(4) + prefix_len(1)
				 + nlri_len_b + sig_segs_size + (SECURE_PATH_SEG_SIZE * data->path_len);
	return bytes_len;
}